

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

int N_VBufPack(N_Vector x,void *buf)

{
  _func_int_N_Vector_void_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = x->ops->nvbufpack;
  if (UNRECOVERED_JUMPTABLE != (_func_int_N_Vector_void_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(x,buf);
    return iVar1;
  }
  return -1;
}

Assistant:

int N_VBufPack(N_Vector x, void *buf)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));
  if (x->ops->nvbufpack == NULL)
    ier = -1;
  else
    ier = x->ops->nvbufpack(x, buf);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return(ier);
}